

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yin_print_augment(lyout *out,int level,lys_module *module,lys_node_augment *augment)

{
  char *attr_value;
  int level_00;
  lys_node *node;
  
  attr_value = transform_json2schema(module,augment->target_name);
  yin_print_open(out,level,(char *)0x0,"augment","target-node",attr_value,1);
  lydict_remove(module->ctx,attr_value);
  level_00 = level + 1;
  if (augment->ext_size != 0) {
    yin_print_extension_instances
              (out,level_00,augment->module,LYEXT_SUBSTMT_SELF,'\0',augment->ext,
               (uint)augment->ext_size);
  }
  if (augment->when != (lys_when *)0x0) {
    yin_print_when(out,level_00,module,augment->when);
  }
  yin_print_snode_common(out,level_00,(lys_node *)augment,augment->module,(int *)0x0,0x72);
  for (node = augment->child; node != (lys_node *)0x0; node = node->next) {
    if (node->parent == (lys_node *)augment) {
      yin_print_snode(out,level_00,node,0xd0ff);
    }
  }
  ly_print(out,"%*s</%s>\n",(ulong)(uint)(level * 2),"","augment");
  return;
}

Assistant:

static void
yin_print_augment(struct lyout *out, int level, const struct lys_module *module,
                  const struct lys_node_augment *augment)
{
    struct lys_node *sub;
    const char *str;

    str = transform_json2schema(module, augment->target_name);
    yin_print_open(out, level, NULL, "augment", "target-node", str, 1);
    lydict_remove(module->ctx, str);
    level++;

    yin_print_snode_common(out, level, (struct lys_node *)augment, augment->module, NULL, SNODE_COMMON_EXT);
    if (augment->when) {
        yin_print_when(out, level, module, augment->when);
    }
    yin_print_snode_common(out, level, (struct lys_node *)augment, augment->module, NULL,
                           SNODE_COMMON_IFF | SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);


    LY_TREE_FOR(augment->child, sub) {
        /* only our augment */
        if (sub->parent != (struct lys_node *)augment) {
            continue;
        }
        yin_print_snode(out, level, sub,
                        LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                        LYS_USES | LYS_ANYDATA | LYS_CASE | LYS_ACTION | LYS_NOTIF);
    }
    level--;

    yin_print_close(out, level, NULL, "augment", 1);
}